

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::PreDecTestUint8(void)

{
  bool bVar1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *pSVar2;
  SafeIntException *anon_var_0;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> vv;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  size_t i;
  allocator local_49;
  string local_48 [43];
  uchar local_1d;
  undefined1 in_stack_ffffffffffffffee;
  uchar in_stack_ffffffffffffffef;
  undefined5 in_stack_fffffffffffffff0;
  uchar uVar3;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff6;
  byte bVar4;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 9; local_8 = local_8 + 1) {
    bVar4 = 1;
    pSVar2 = (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)&stack0xfffffffffffffff6;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(pSVar2,dec_uint8 + local_8 * 3);
    pSVar2 = SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator--(pSVar2);
    local_1d = pSVar2->m_int;
    uVar3 = local_1d;
    bVar1 = operator!=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,'\0');
    if (bVar1) {
      bVar4 = 0;
    }
    if ((bVar4 & 1) != (dec_uint8[local_8 * 3 + 2] & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"Error in case dec_uint8 throw (1): ",&local_49);
      err_msg<unsigned_char>
                ((string *)
                 CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffff6.m_int,
                                         CONCAT15(uVar3,in_stack_fffffffffffffff0))),
                 in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
  }
  return;
}

Assistant:

void PreDecTestUint8()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_uint8); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint8_t> si(dec_uint8[i].x);
			SafeInt<std::uint8_t> vv = --si;

			if(vv != dec_uint8[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_uint8[i].fExpected )
		{
			err_msg( "Error in case dec_uint8 throw (1): ", dec_uint8[i].x, dec_uint8[i].fExpected );
		}
	}
}